

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

void CB_EXPLORE::output_example(vw *all,cb_explore *data,example *ec,label *ld)

{
  v_array<char> *pvVar1;
  int iVar2;
  shared_data *this;
  int *piVar3;
  _func_void_int_string_v_array<char> *p_Var4;
  v_array<char> vVar5;
  uint uVar6;
  bool bVar7;
  cb_class *pcVar8;
  action_score *paVar9;
  uint uVar10;
  uint32_t action;
  ulong uVar11;
  uint uVar12;
  int *piVar13;
  float loss;
  float fVar14;
  undefined4 in_stack_fffffffffffffc68;
  example *ec_00;
  char temp_str [20];
  string local_360 [32];
  stringstream sso;
  ostream local_330;
  stringstream ss;
  ostream local_1a8;
  
  pcVar8 = GEN_CS::get_observed_cost(ld);
  (data->cbcs).known_cost = pcVar8;
  if (pcVar8 == (cb_class *)0x0) {
    loss = 0.0;
  }
  else {
    paVar9 = (action_score *)(ec->pred).scalars._begin;
    loss = 0.0;
    for (action = 1;
        (ulong)(action - 1) < (ulong)((long)(ec->pred).scalars._end - (long)paVar9 >> 3);
        action = action + 1) {
      fVar14 = CB_ALGS::get_unbiased_cost((data->cbcs).known_cost,&(data->cbcs).pred_scores,action);
      paVar9 = (ec->pred).a_s._begin;
      loss = loss + fVar14 * paVar9[action - 1].score;
    }
  }
  this = all->sd;
  bVar7 = ec->test_only;
  ec_00 = ec;
  pcVar8 = GEN_CS::get_observed_cost(ld);
  shared_data::update(this,bVar7,pcVar8 != (cb_class *)0x0,loss,1.0,ec->num_features);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&sso);
  paVar9 = (ec->pred).a_s._begin;
  uVar10 = 0;
  fVar14 = 0.0;
  for (uVar12 = 1; uVar11 = (ulong)(uVar12 - 1),
      uVar11 < (ulong)((long)(ec->pred).scalars._end - (long)paVar9 >> 3); uVar12 = uVar12 + 1) {
    sprintf(temp_str,"%f ",SUB84((double)paVar9[uVar11].score,0));
    loss = fVar14;
    ec = ec_00;
    std::operator<<(&local_1a8,temp_str);
    paVar9 = (ec->pred).a_s._begin;
    fVar14 = paVar9[uVar11].score;
    uVar6 = uVar12;
    if (fVar14 <= loss) {
      fVar14 = loss;
      uVar6 = uVar10;
    }
    uVar10 = uVar6;
    ec_00 = ec;
  }
  sprintf(temp_str,"%d:%f",SUB84((double)fVar14,0),(ulong)uVar10);
  std::operator<<(&local_330,temp_str);
  piVar3 = (all->final_prediction_sink)._end;
  pvVar1 = &ec_00->tag;
  for (piVar13 = (all->final_prediction_sink)._begin; piVar13 != piVar3; piVar13 = piVar13 + 1) {
    iVar2 = *piVar13;
    p_Var4 = all->print_text;
    std::__cxx11::stringbuf::str();
    vVar5._begin._4_4_ = loss;
    vVar5._begin._0_4_ = in_stack_fffffffffffffc68;
    vVar5._end = (char *)all;
    vVar5.end_array = (char *)ec_00;
    vVar5.erase_count = (size_t)ld;
    (*p_Var4)(iVar2,(string)*pvVar1,vVar5);
    std::__cxx11::string::~string(local_360);
  }
  bVar7 = (bool)(*(code *)PTR_test_label_002b5e60)(ld);
  print_update_cb_explore(all,bVar7,ec_00,&sso);
  std::__cxx11::stringstream::~stringstream((stringstream *)&sso);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void output_example(vw& all, cb_explore& data, example& ec, CB::label& ld)
{
  float loss = 0.;

  cb_to_cs& c = data.cbcs;

  if ((c.known_cost = get_observed_cost(ld)) != nullptr)
    for (uint32_t i = 0; i < ec.pred.a_s.size(); i++)
      loss += get_unbiased_cost(c.known_cost, c.pred_scores, i+1) * ec.pred.a_s[i].score;

  all.sd->update(ec.test_only, get_observed_cost(ld) != nullptr, loss, 1.f, ec.num_features);

  char temp_str[20];
  stringstream ss, sso;
  float maxprob = 0.;
  uint32_t maxid = 0;
  for (uint32_t i = 0; i < ec.pred.a_s.size(); i++)
  {
    sprintf(temp_str, "%f ", ec.pred.a_s[i].score);
    ss << temp_str;
    if (ec.pred.a_s[i].score > maxprob)
    {
      maxprob = ec.pred.a_s[i].score;
      maxid = i + 1;
    }
  }

  sprintf(temp_str, "%d:%f", maxid, maxprob);
  sso << temp_str;

  for (int sink : all.final_prediction_sink) all.print_text(sink, ss.str(), ec.tag);

  print_update_cb_explore(all, CB::cb_label.test_label(&ld), ec, sso);
}